

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
          (ArenaVectorBase<ArenaVector<bool>,bool> *this,vector<bool,_std::allocator<bool>_> *list)

{
  ulong size;
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  puVar1 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  size = (ulong)uVar3 + ((long)puVar2 - (long)puVar1) * 8;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<bool>::allocate((ArenaVector<bool> *)this,size);
    puVar1 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    puVar2 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (list->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
  }
  lVar4 = *(long *)this;
  uVar6 = 0;
  while ((uVar5 = (uint)uVar6, puVar1 != puVar2 || (uVar5 != uVar3))) {
    *(bool *)lVar4 = (*puVar1 >> (uVar6 & 0x3f) & 1) != 0;
    puVar1 = puVar1 + (uVar5 == 0x3f);
    uVar6 = (ulong)(uVar5 + 1);
    if (uVar5 == 0x3f) {
      uVar6 = 0;
    }
    lVar4 = lVar4 + 1;
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }